

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR skip_section(lyxml_ctx *xmlctx,char *delim,size_t delim_len,char *sectname)

{
  long local_60;
  uint64_t newlines;
  uint64_t parsed;
  char *b;
  char *a;
  char *input;
  size_t i;
  char *sectname_local;
  size_t delim_len_local;
  char *delim_local;
  lyxml_ctx *xmlctx_local;
  
  newlines = 0;
  local_60 = 0;
  a = xmlctx->in->current;
  do {
    if (*a == '\0') {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"%s not terminated.",sectname);
      return LY_EVALID;
    }
    if (*a == *delim) {
      b = a;
      parsed = (uint64_t)delim;
      for (input = (char *)0x0; input < delim_len; input = input + 1) {
        if (*b != *(char *)parsed) break;
        parsed = parsed + 1;
        b = b + 1;
      }
      if (input == (char *)delim_len) {
        xmlctx->in->line = local_60 + xmlctx->in->line;
        ly_in_skip(xmlctx->in,newlines + delim_len);
        return LY_SUCCESS;
      }
    }
    else if (*a == '\n') {
      local_60 = local_60 + 1;
    }
    a = a + 1;
    newlines = newlines + 1;
  } while( true );
}

Assistant:

LY_ERR
skip_section(struct lyxml_ctx *xmlctx, const char *delim, size_t delim_len, const char *sectname)
{
    size_t i;
    register const char *input, *a, *b;
    uint64_t parsed = 0, newlines = 0;

    for (input = xmlctx->in->current; *input; ++input, ++parsed) {
        if (*input != *delim) {
            if (*input == '\n') {
                ++newlines;
            }
            continue;
        }
        a = input;
        b = delim;
        for (i = 0; i < delim_len; ++i) {
            if (*a++ != *b++) {
                break;
            }
        }
        if (i == delim_len) {
            /* delim found */
            xmlctx->in->line += newlines;
            ly_in_skip(xmlctx->in, parsed + delim_len);
            return LY_SUCCESS;
        }
    }

    /* delim not found,
     * do not update input handler to refer to the beginning of the section in error message */
    LOGVAL(xmlctx->ctx, LY_VCODE_NTERM, sectname);
    return LY_EVALID;
}